

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_create_resolving_functions(JSContext *ctx,JSValue *resolving_funcs,JSValue promise)

{
  int iVar1;
  int64_t iVar2;
  JSRuntime *pJVar3;
  bool bVar4;
  bool bVar5;
  int *piVar6;
  JSValueUnion JVar7;
  JSValueUnion *pJVar8;
  JSValueUnion JVar9;
  JSRefCountHeader *p;
  int iVar10;
  long lVar11;
  JSValue JVar12;
  uint local_38;
  
  JVar9 = promise.u;
  piVar6 = (int *)js_malloc(ctx,8);
  if (piVar6 == (int *)0x0) {
    iVar10 = -1;
  }
  else {
    piVar6[0] = 1;
    piVar6[1] = 0;
    lVar11 = 0;
    bVar5 = true;
    do {
      bVar4 = bVar5;
      JVar12 = JS_NewObjectProtoClass(ctx,ctx->function_proto,(int)lVar11 + 0x2b);
      JVar7 = JVar12.u;
      if ((JVar12.tag & 0xffffffffU) == 6) {
LAB_00146831:
        iVar10 = -1;
        if ((!bVar4) && (iVar2 = resolving_funcs->tag, 0xfffffff4 < (uint)iVar2)) {
          JVar9 = (JSValueUnion)(resolving_funcs->u).ptr;
          iVar1 = *JVar9.ptr;
          *(int *)JVar9.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            JVar12.tag = iVar2;
            JVar12.u.ptr = JVar9.ptr;
            __JS_FreeValueRT(ctx->rt,JVar12);
          }
        }
        break;
      }
      pJVar8 = (JSValueUnion *)js_malloc(ctx,0x18);
      if (pJVar8 == (JSValueUnion *)0x0) {
        if ((0xfffffff4 < (uint)JVar12.tag) &&
           (iVar10 = *JVar7.ptr, *(int *)JVar7.ptr = iVar10 + -1, iVar10 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar12);
        }
        goto LAB_00146831;
      }
      *piVar6 = *piVar6 + 1;
      pJVar8[2].ptr = piVar6;
      local_38 = (uint)promise.tag;
      if (0xfffffff4 < local_38) {
        *(int *)JVar9.ptr = *JVar9.ptr + 1;
      }
      pJVar8->ptr = (void *)JVar9;
      pJVar8[1] = (JSValueUnion)promise.tag;
      if ((uint)JVar12.tag == 0xffffffff) {
        *(JSValueUnion **)((long)JVar7.ptr + 0x30) = pJVar8;
      }
      js_function_set_properties(ctx,JVar12,0x2f,1);
      resolving_funcs[lVar11].u.ptr = (void *)JVar7;
      resolving_funcs[lVar11].tag = JVar12.tag;
      iVar10 = 0;
      lVar11 = 1;
      bVar5 = false;
    } while (bVar4);
    pJVar3 = ctx->rt;
    *piVar6 = *piVar6 + -1;
    if (*piVar6 == 0) {
      (*(pJVar3->mf).js_free)(&pJVar3->malloc_state,piVar6);
    }
  }
  return iVar10;
}

Assistant:

static int js_create_resolving_functions(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst promise)

{
    JSValue obj;
    JSPromiseFunctionData *s;
    JSPromiseFunctionDataResolved *sr;
    int i, ret;

    sr = js_malloc(ctx, sizeof(*sr));
    if (!sr)
        return -1;
    sr->ref_count = 1;
    sr->already_resolved = FALSE; /* must be shared between the two functions */
    ret = 0;
    for(i = 0; i < 2; i++) {
        obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                     JS_CLASS_PROMISE_RESOLVE_FUNCTION + i);
        if (JS_IsException(obj))
            goto fail;
        s = js_malloc(ctx, sizeof(*s));
        if (!s) {
            JS_FreeValue(ctx, obj);
        fail:

            if (i != 0)
                JS_FreeValue(ctx, resolving_funcs[0]);
            ret = -1;
            break;
        }
        sr->ref_count++;
        s->presolved = sr;
        s->promise = JS_DupValue(ctx, promise);
        JS_SetOpaque(obj, s);
        js_function_set_properties(ctx, obj, JS_ATOM_empty_string, 1);
        resolving_funcs[i] = obj;
    }
    js_promise_resolve_function_free_resolved(ctx->rt, sr);
    return ret;
}